

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void duplicate_objects_sel_repeat_proc(Am_Object *command_obj)

{
  Am_Value local_28;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *command_obj_local;
  
  local_10 = command_obj;
  Am_Object::Am_Object(&local_18,command_obj);
  Am_Value::Am_Value(&local_28,&Am_No_Value);
  duplicate_general_repeat(&local_18,false,&local_28);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, duplicate_objects_sel_repeat,
                 (Am_Object command_obj))
{
  duplicate_general_repeat(command_obj, false, Am_No_Value);
}